

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,ChunkHeader *header)

{
  MaskRectRaw *pMVar1;
  MaskRect *mask;
  MaskRectRaw *pMVar2;
  MaskRectRaw m;
  ChunkHeaderRaw local_3c;
  
  local_3c.type.value_ = (uchar  [2])header->type;
  local_3c.masks.value_ =
       SUB42((uint)(*(int *)&(header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3,0);
  local_3c.transparentMasks.value_ =
       SUB42((uint)(*(int *)&(header->transparentMasks).
                             super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                   *(int *)&(header->transparentMasks).
                            super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3,0);
  local_3c.alignmentWords.value_ = (uchar  [2])header->alignmentWords;
  local_3c.x.value_ = (uchar  [2])header->x;
  local_3c.y.value_ = (uchar  [2])header->y;
  local_3c.w.value_ = (uchar  [2])header->w;
  local_3c.h.value_ = (uchar  [2])header->h;
  local_3c.size.value_ = (uchar  [4])header->size;
  writeRaw<ChunkHeaderRaw>(stream,&local_3c);
  pMVar1 = (MaskRectRaw *)
           (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar2 = (MaskRectRaw *)
                (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1) {
    m = *pMVar2;
    writeRaw<MaskRectRaw>(stream,&m);
  }
  pMVar1 = (MaskRectRaw *)
           (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar2 = (MaskRectRaw *)
                (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1) {
    m = *pMVar2;
    writeRaw<MaskRectRaw>(stream,&m);
  }
  std::ostream::seekp((long)stream,(uint)header->alignmentWords * 2);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const ChunkHeader& header) {
	ChunkHeaderRaw h;
	h.type = static_cast<uint16_t>(header.type);
	h.masks = header.masks.size();
	h.transparentMasks = header.transparentMasks.size();
	h.alignmentWords = header.alignmentWords;
	h.x = header.x;
	h.y = header.y;
	h.w = header.w;
	h.h = header.h;
	h.size = header.size;
	writeRaw(stream, h);
	for (const auto& mask : header.masks) {
		MaskRectRaw m = mask;
		writeRaw(stream, m);
	}
	for (const auto& tmask : header.transparentMasks) {
		MaskRectRaw m = tmask;
		writeRaw(stream, m);
	}
	stream.seekp(header.alignmentWords * 2, stream.cur);
	return stream;
}